

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O1

void __thiscall nite::Font::load(Font *this,string *path,uint size,float thickness)

{
  pointer *pppFVar1;
  pointer *path_00;
  uint uVar2;
  uint uVar3;
  int iVar4;
  pointer pcVar5;
  iterator iVar6;
  FT_GlyphSlot_conflict pFVar7;
  void *pvVar8;
  Vec2 VVar9;
  pointer pfVar10;
  pointer pfVar11;
  undefined1 __s2 [8];
  bool bVar12;
  FT_Error FVar13;
  int iVar14;
  FT_UInt glyph_index;
  Vec2 *pVVar15;
  long *plVar16;
  Vec2 VVar17;
  ulong uVar18;
  undefined8 *puVar19;
  FT_Glyph pFVar20;
  size_type *psVar21;
  FT_Face_conflict pFVar22;
  uint number;
  int number_00;
  int number_01;
  int number_02;
  undefined1 *puVar23;
  float *pfVar24;
  FT_Library pFVar25;
  Vec2 VVar26;
  long lVar27;
  int iVar28;
  ulong uVar29;
  undefined1 local_1228 [4104];
  _Alloc_hider local_220;
  char local_210 [16];
  _Alloc_hider local_200;
  char local_1f0 [40];
  pointer local_1c8;
  _Alloc_hider local_1b0;
  char local_1a0 [24];
  undefined1 local_188 [8];
  string fileHash;
  FT_Stroker local_158;
  FT_Stroker stroker;
  FT_Glyph glyph;
  vector<Single,_std::allocator<Single>_> frags;
  string filename;
  FT_Glyph stroke;
  string pathAndSize;
  FT_Library library;
  undefined1 local_d8 [8];
  GLuint atlas;
  undefined1 local_c8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  uint local_94;
  Vec2 local_90;
  Vec2 dims;
  FT_Face local_80;
  FT_Face_conflict face;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  float local_34;
  
  frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&filename._M_string_length;
  pcVar5 = (path->_M_dataplus)._M_p;
  path_00 = &frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  local_34 = thickness;
  std::__cxx11::string::_M_construct<char*>
            ((string *)path_00,pcVar5,pcVar5 + path->_M_string_length);
  this->ln = -1.0;
  bVar12 = fileExists((string *)path_00);
  if (bVar12) {
    FVar13 = FT_Init_FreeType((FT_Library *)((long)&pathAndSize.field_2 + 8));
    if (FVar13 != 0) {
      print("failure starting FreeType: FT_Init_FreeType");
      goto LAB_0019ab26;
    }
    FVar13 = FT_New_Face((FT_Library)pathAndSize.field_2._8_8_,
                         (char *)frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage,0,&local_80);
    if (FVar13 != 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stroke,
                     "failure loading font \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
      pVVar15 = (Vec2 *)std::__cxx11::string::append((char *)&stroke);
      VVar26 = (Vec2)(pVVar15 + 2);
      if (*pVVar15 == VVar26) {
        local_1228._16_8_ = *(undefined8 *)VVar26;
        local_1228._24_8_ = pVVar15[3];
        local_1228._0_8_ = (long)local_1228 + 0x10;
      }
      else {
        local_1228._16_8_ = *(undefined8 *)VVar26;
        local_1228._0_8_ = *pVVar15;
      }
      local_1228._8_8_ = pVVar15[1];
      *pVVar15 = VVar26;
      pVVar15[1].x = 0.0;
      pVVar15[1].y = 0.0;
      *(undefined1 *)&pVVar15[2].x = 0;
      print((string *)local_1228);
      if (local_1228._0_8_ != (long)local_1228 + 0x10) {
        operator_delete((void *)local_1228._0_8_);
      }
      if (stroke != (FT_Glyph)&pathAndSize._M_string_length) {
        operator_delete(stroke);
      }
      FT_Done_FreeType((FT_Library)pathAndSize.field_2._8_8_);
      goto LAB_0019ab26;
    }
    unload(this);
    toStr_abi_cxx11_((string *)local_1228,(nite *)(ulong)size,number);
    fileHash.field_2._8_8_ = path;
    local_94 = size;
    plVar16 = (long *)std::__cxx11::string::replace
                                ((ulong)local_1228,0,(char *)0x0,(ulong)(path->_M_dataplus)._M_p);
    stroke = (FT_Glyph)&pathAndSize._M_string_length;
    pFVar20 = (FT_Glyph)(plVar16 + 2);
    if ((FT_Glyph)*plVar16 == pFVar20) {
      pathAndSize._M_string_length = (size_type)pFVar20->library;
      pathAndSize.field_2._M_allocated_capacity = plVar16[3];
    }
    else {
      pathAndSize._M_string_length = (size_type)pFVar20->library;
      stroke = (FT_Glyph)*plVar16;
    }
    pathAndSize._M_dataplus._M_p = (pointer)plVar16[1];
    *plVar16 = (long)pFVar20;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    if (local_1228._0_8_ != (long)local_1228 + 0x10) {
      operator_delete((void *)local_1228._0_8_);
    }
    hashMemory_abi_cxx11_
              ((string *)local_188,(nite *)stroke,pathAndSize._M_dataplus._M_p,(size_t)pFVar20);
    __s2 = local_188;
    pfVar11 = fontList.super__Vector_base<fontT,_std::allocator<fontT>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pfVar10 = fontList.super__Vector_base<fontT,_std::allocator<fontT>_>._M_impl.
              super__Vector_impl_data._M_start;
    dims = (Vec2)(((long)fontList.super__Vector_base<fontT,_std::allocator<fontT>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)fontList.super__Vector_base<fontT,_std::allocator<fontT>_>._M_impl.
                         super__Vector_impl_data._M_start >> 5) * 0x133f84cfe133f84d);
    VVar17.x = -NAN;
    if (fontList.super__Vector_base<fontT,_std::allocator<fontT>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        fontList.super__Vector_base<fontT,_std::allocator<fontT>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      library = (FT_Library)
                fontList.super__Vector_base<fontT,_std::allocator<fontT>_>._M_impl.
                super__Vector_impl_data._M_finish;
      VVar26.x = 0.0;
      VVar26.y = 0.0;
      do {
        pcVar5 = (pointer)pfVar10[(long)VVar26].hash._M_string_length;
        VVar17.x = VVar26.x;
        if ((pcVar5 == fileHash._M_dataplus._M_p) &&
           ((pcVar5 == (pointer)0x0 ||
            (iVar14 = bcmp(pfVar10[(long)VVar26].hash._M_dataplus._M_p,(void *)__s2,(size_t)pcVar5),
            iVar14 == 0)))) goto LAB_0019ac57;
        VVar26.x = (float)((int)VVar17.x + 1);
        VVar26.y = 0.0;
      } while ((ulong)VVar26 < (ulong)dims);
      VVar17.x = -NAN;
    }
LAB_0019ac57:
    this->objectId = (int)VVar17.x;
    local_1228._0_8_ = this;
    if ((int)VVar17.x < 0) {
      bVar12 = pfVar11 != pfVar10;
      if (pfVar11 == pfVar10) {
LAB_0019acca:
        fontT::fontT((fontT *)local_1228);
        std::vector<fontT,_std::allocator<fontT>_>::emplace_back<fontT>
                  (&fontList,(fontT *)local_1228);
        if (local_1b0._M_p != local_1a0) {
          operator_delete(local_1b0._M_p);
        }
        if (local_1c8 != (pointer)0x0) {
          operator_delete(local_1c8);
        }
        if (local_200._M_p != local_1f0) {
          operator_delete(local_200._M_p);
        }
        if (local_220._M_p != local_210) {
          operator_delete(local_220._M_p);
        }
        VVar17.x = dims.x;
      }
      else {
        VVar17.x = 0.0;
        if (pfVar10->empty == false) {
          VVar17.x = 0.0;
          VVar17.y = 0.0;
          do {
            VVar17.x = (float)((int)VVar17.x + 1);
            VVar17.y = 0.0;
            bVar12 = (ulong)VVar17 < (ulong)dims;
            if ((ulong)dims <= (ulong)VVar17) goto LAB_0019acca;
          } while (pfVar10[(long)VVar17].empty == false);
        }
        if (!bVar12) goto LAB_0019acca;
      }
      this->objectId = (int)VVar17.x;
      pfVar10 = fontList.super__Vector_base<fontT,_std::allocator<fontT>_>._M_impl.
                super__Vector_impl_data._M_start;
      fontList.super__Vector_base<fontT,_std::allocator<fontT>_>._M_impl.super__Vector_impl_data.
      _M_start[(int)VVar17.x].empty = false;
      iVar6._M_current =
           pfVar10[(int)VVar17.x].owners.
           super__Vector_base<nite::Font_*,_std::allocator<nite::Font_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          pfVar10[(int)VVar17.x].owners.
          super__Vector_base<nite::Font_*,_std::allocator<nite::Font_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<nite::Font*,std::allocator<nite::Font*>>::_M_realloc_insert<nite::Font*>
                  ((vector<nite::Font*,std::allocator<nite::Font*>> *)&pfVar10[(int)VVar17.x].owners
                   ,iVar6,(Font **)local_1228);
      }
      else {
        *iVar6._M_current = this;
        pppFVar1 = &pfVar10[(int)VVar17.x].owners.
                    super__Vector_base<nite::Font_*,_std::allocator<nite::Font_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppFVar1 = *pppFVar1 + 1;
      }
      std::__cxx11::string::_M_assign
                ((string *)
                 &fontList.super__Vector_base<fontT,_std::allocator<fontT>_>._M_impl.
                  super__Vector_impl_data._M_start[this->objectId].hash);
      std::__cxx11::string::_M_assign
                ((string *)
                 &fontList.super__Vector_base<fontT,_std::allocator<fontT>_>._M_impl.
                  super__Vector_impl_data._M_start[this->objectId].filename);
      pfVar10 = fontList.super__Vector_base<fontT,_std::allocator<fontT>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar14 = this->objectId;
      FVar13 = FT_Set_Char_Size(local_80,(ulong)(local_94 << 6),(ulong)(local_94 << 6),0x60,0x60);
      if (FVar13 == 0) {
        if (0.0 < local_34) {
          FT_Stroker_New((FT_Library)pathAndSize.field_2._8_8_,&local_158);
          FT_Stroker_Set(local_158,(long)(int)(local_34 * 64.0),FT_STROKER_LINECAP_ROUND,
                         FT_STROKER_LINEJOIN_ROUND,0);
        }
        glyph = (FT_Glyph)0x0;
        frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        Vec2::Vec2(&local_90);
        pfVar24 = &pfVar10[iVar14].glyphs[0x20].index.y;
        dims.x = 0.0;
        dims.y = 0.0;
        uVar29 = 0x20;
        do {
          VVar26 = (Vec2)((long)local_1228 + 0x10);
          glyph_index = FT_Get_Char_Index(local_80,uVar29);
          FVar13 = FT_Load_Glyph(local_80,glyph_index,0);
          if (FVar13 == 0) {
            FVar13 = FT_Get_Glyph(local_80->glyph,(FT_Glyph *)&stroker);
            if (FVar13 == 0) {
              if (0.0 < local_34) {
                FVar13 = FT_Get_Glyph(local_80->glyph,(FT_Glyph *)((long)&filename.field_2 + 8));
                if (FVar13 != 0) {
                  toStr_abi_cxx11_((string *)local_d8,(nite *)(uVar29 & 0xffffffff),number_02);
                  std::operator+(&local_b8,"failed to load char \'",(string *)local_d8);
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_b8);
                  face = (FT_Face_conflict)&local_68;
                  pFVar22 = (FT_Face_conflict)(plVar16 + 2);
                  if ((FT_Face_conflict)*plVar16 == pFVar22) {
                    local_68._M_allocated_capacity = pFVar22->num_faces;
                    local_68._8_8_ = plVar16[3];
                  }
                  else {
                    local_68._M_allocated_capacity = pFVar22->num_faces;
                    face = (FT_Face_conflict)*plVar16;
                  }
                  local_70 = plVar16[1];
                  *plVar16 = (long)pFVar22;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  std::operator+(&local_58,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&face,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&frags.
                                              super__Vector_base<Single,_std::allocator<Single>_>.
                                              _M_impl.super__Vector_impl_data._M_end_of_storage);
                  pVVar15 = (Vec2 *)std::__cxx11::string::append((char *)&local_58);
                  VVar17 = (Vec2)(pVVar15 + 2);
                  if (*pVVar15 == VVar17) {
                    local_1228._16_8_ = *(undefined8 *)VVar17;
                    local_1228._24_8_ = pVVar15[3];
                    local_1228._0_8_ = VVar26;
                  }
                  else {
                    local_1228._16_8_ = *(undefined8 *)VVar17;
                    local_1228._0_8_ = *pVVar15;
                  }
                  local_1228._8_8_ = pVVar15[1];
                  *pVVar15 = VVar17;
                  pVVar15[1].x = 0.0;
                  pVVar15[1].y = 0.0;
                  *(undefined1 *)&pVVar15[2].x = 0;
                  print((string *)local_1228);
                  if ((Vec2)local_1228._0_8_ != VVar26) {
                    operator_delete((void *)local_1228._0_8_);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_58._M_dataplus._M_p != &local_58.field_2) {
                    operator_delete(local_58._M_dataplus._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)face != &local_68) {
                    operator_delete(face);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                    operator_delete(local_b8._M_dataplus._M_p);
                  }
                  puVar23 = (undefined1 *)CONCAT44(local_d8._4_4_,local_d8._0_4_);
                  if (puVar23 != local_c8) goto LAB_0019b3e6;
                  goto LAB_0019b3eb;
                }
                FT_Glyph_StrokeBorder
                          ((FT_Glyph *)((long)&filename.field_2 + 8),local_158,'\0','\x01');
              }
              FT_Glyph_To_Bitmap((FT_Glyph *)&stroker,FT_RENDER_MODE_NORMAL,(FT_Vector *)0x0,'\x01')
              ;
              pFVar25 = (FT_Library)stroker;
              if (0.0 < local_34) {
                FT_Glyph_To_Bitmap((FT_Glyph *)((long)&filename.field_2 + 8),FT_RENDER_MODE_NORMAL,
                                   (FT_Vector *)0x0,'\x01');
                library = (FT_Library)filename.field_2._8_8_;
              }
              local_1228._0_4_ = 0.0;
              local_1228._4_4_ = 0.0;
              local_1228._8_4_ = 0.0;
              local_1228._12_4_ = 0.0;
              if ((local_34 != 0.0) || (NAN(local_34))) {
                Single::strong((Single *)local_1228,*(int *)((long)library->modules + 0x1c),
                               *(int *)(library->modules + 3),(uchar *)library->modules[5]);
                Single::blitz((Single *)local_1228,
                              *(int *)((long)&((FT_Stroker)pFVar25)->subpath_angle + 4),
                              (int)((FT_Stroker)pFVar25)->subpath_angle,
                              (uchar *)(((FT_Stroker)pFVar25)->subpath_start).y);
              }
              else {
                Single::pure((Single *)local_1228,
                             *(int *)((long)&((FT_Stroker)pFVar25)->subpath_angle + 4),
                             (int)((FT_Stroker)pFVar25)->subpath_angle,
                             (uchar *)(((FT_Stroker)pFVar25)->subpath_start).y);
              }
              if (frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
                  super__Vector_impl_data._M_start ==
                  frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<Single,std::allocator<Single>>::_M_realloc_insert<Single_const&>
                          ((vector<Single,std::allocator<Single>> *)&glyph,
                           (iterator)
                           frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
                           super__Vector_impl_data._M_start,(Single *)local_1228);
              }
              else {
                (frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
                 super__Vector_impl_data._M_start)->size = local_1228._16_8_;
                (frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
                 super__Vector_impl_data._M_start)->w = local_1228._0_4_;
                (frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
                 super__Vector_impl_data._M_start)->h = local_1228._4_4_;
                (frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
                 super__Vector_impl_data._M_start)->buffer = (uchar *)local_1228._8_8_;
                frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
                super__Vector_impl_data._M_start =
                     frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
                     super__Vector_impl_data._M_start + 1;
              }
              if (local_34 != 0.0) {
                pFVar25 = library;
              }
              if (NAN(local_34)) {
                pFVar25 = library;
              }
              ((Vec2 *)(pfVar24 + -1))->x = (float)(int)dims.x;
              *pfVar24 = 0.0;
              uVar2 = *(uint *)((long)pFVar25->modules + 0x1c);
              pfVar24[-7] = (float)uVar2;
              uVar3 = *(uint *)(pFVar25->modules + 3);
              pfVar24[-6] = (float)uVar3;
              pfVar24[-3] = (float)*(int *)(pFVar25->modules + 2);
              pfVar24[-2] = (float)*(int *)((long)pFVar25->modules + 0x14);
              pFVar7 = local_80->glyph;
              pfVar24[-5] = (float)((pFVar7->advance).x >> 6);
              pfVar24[-4] = (float)((pFVar7->metrics).horiBearingY >> 6);
              local_90.x = (float)(uVar2 + 2) + local_90.x;
              uVar18 = (long)local_90.y & 0xffffffff;
              if ((uint)(long)local_90.y < uVar3) {
                uVar18 = (ulong)uVar3;
              }
              local_90.y = (float)uVar18;
              FT_Done_Glyph((FT_Glyph)stroker);
              if (0.0 < local_34) {
                FT_Done_Glyph((FT_Glyph)filename.field_2._8_8_);
              }
              dims.x = (float)((int)dims.x + uVar2 + 2);
              dims.y = 0.0;
            }
            else {
              toStr_abi_cxx11_((string *)local_d8,(nite *)(uVar29 & 0xffffffff),number_01);
              puVar19 = (undefined8 *)
                        std::__cxx11::string::replace((ulong)local_d8,0,(char *)0x0,0x248270);
              local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
              psVar21 = puVar19 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar19 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar21) {
                local_b8.field_2._M_allocated_capacity = *psVar21;
                local_b8.field_2._8_8_ = puVar19[3];
              }
              else {
                local_b8.field_2._M_allocated_capacity = *psVar21;
                local_b8._M_dataplus._M_p = (pointer)*puVar19;
              }
              local_b8._M_string_length = puVar19[1];
              *puVar19 = psVar21;
              puVar19[1] = 0;
              *(undefined1 *)(puVar19 + 2) = 0;
              plVar16 = (long *)std::__cxx11::string::append((char *)&local_b8);
              face = (FT_Face_conflict)&local_68;
              pFVar22 = (FT_Face_conflict)(plVar16 + 2);
              if ((FT_Face_conflict)*plVar16 == pFVar22) {
                local_68._M_allocated_capacity = pFVar22->num_faces;
                local_68._8_8_ = plVar16[3];
              }
              else {
                local_68._M_allocated_capacity = pFVar22->num_faces;
                face = (FT_Face_conflict)*plVar16;
              }
              local_70 = plVar16[1];
              *plVar16 = (long)pFVar22;
              plVar16[1] = 0;
              *(undefined1 *)(plVar16 + 2) = 0;
              puVar19 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&face,
                                   (ulong)frags.super__Vector_base<Single,_std::allocator<Single>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage);
              local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
              psVar21 = puVar19 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar19 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar21) {
                local_58.field_2._M_allocated_capacity = *psVar21;
                local_58.field_2._8_8_ = puVar19[3];
              }
              else {
                local_58.field_2._M_allocated_capacity = *psVar21;
                local_58._M_dataplus._M_p = (pointer)*puVar19;
              }
              local_58._M_string_length = puVar19[1];
              *puVar19 = psVar21;
              puVar19[1] = 0;
              *(undefined1 *)(puVar19 + 2) = 0;
              pVVar15 = (Vec2 *)std::__cxx11::string::append((char *)&local_58);
              VVar17 = (Vec2)(pVVar15 + 2);
              if (*pVVar15 == VVar17) {
                local_1228._16_8_ = *(undefined8 *)VVar17;
                local_1228._24_8_ = pVVar15[3];
                local_1228._0_8_ = VVar26;
              }
              else {
                local_1228._16_8_ = *(undefined8 *)VVar17;
                local_1228._0_8_ = *pVVar15;
              }
              local_1228._8_8_ = pVVar15[1];
              *pVVar15 = VVar17;
              pVVar15[1].x = 0.0;
              pVVar15[1].y = 0.0;
              *(undefined1 *)&pVVar15[2].x = 0;
              print((string *)local_1228);
              if ((Vec2)local_1228._0_8_ != VVar26) {
                operator_delete((void *)local_1228._0_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_dataplus._M_p != &local_58.field_2) {
                operator_delete(local_58._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)face != &local_68) {
                operator_delete(face);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                operator_delete(local_b8._M_dataplus._M_p);
              }
              puVar23 = (undefined1 *)CONCAT44(local_d8._4_4_,local_d8._0_4_);
              if (puVar23 != local_c8) goto LAB_0019b3e6;
            }
          }
          else {
            toStr_abi_cxx11_((string *)local_d8,(nite *)(uVar29 & 0xffffffff),number_00);
            plVar16 = (long *)std::__cxx11::string::replace((ulong)local_d8,0,(char *)0x0,0x248270);
            local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
            psVar21 = (size_type *)(plVar16 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar16 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar21) {
              local_b8.field_2._M_allocated_capacity = *psVar21;
              local_b8.field_2._8_8_ = plVar16[3];
            }
            else {
              local_b8.field_2._M_allocated_capacity = *psVar21;
              local_b8._M_dataplus._M_p = (pointer)*plVar16;
            }
            local_b8._M_string_length = plVar16[1];
            *plVar16 = (long)psVar21;
            plVar16[1] = 0;
            *(undefined1 *)(plVar16 + 2) = 0;
            plVar16 = (long *)std::__cxx11::string::append((char *)&local_b8);
            face = (FT_Face_conflict)&local_68;
            pFVar22 = (FT_Face_conflict)(plVar16 + 2);
            if ((FT_Face_conflict)*plVar16 == pFVar22) {
              local_68._M_allocated_capacity = pFVar22->num_faces;
              local_68._8_8_ = plVar16[3];
            }
            else {
              local_68._M_allocated_capacity = pFVar22->num_faces;
              face = (FT_Face_conflict)*plVar16;
            }
            local_70 = plVar16[1];
            *plVar16 = (long)pFVar22;
            plVar16[1] = 0;
            *(undefined1 *)(plVar16 + 2) = 0;
            plVar16 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&face,
                                         (ulong)frags.
                                                super__Vector_base<Single,_std::allocator<Single>_>.
                                                _M_impl.super__Vector_impl_data._M_end_of_storage);
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            psVar21 = (size_type *)(plVar16 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar16 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar21) {
              local_58.field_2._M_allocated_capacity = *psVar21;
              local_58.field_2._8_8_ = plVar16[3];
            }
            else {
              local_58.field_2._M_allocated_capacity = *psVar21;
              local_58._M_dataplus._M_p = (pointer)*plVar16;
            }
            local_58._M_string_length = plVar16[1];
            *plVar16 = (long)psVar21;
            plVar16[1] = 0;
            *(undefined1 *)(plVar16 + 2) = 0;
            pVVar15 = (Vec2 *)std::__cxx11::string::append((char *)&local_58);
            VVar17 = (Vec2)(pVVar15 + 2);
            if (*pVVar15 == VVar17) {
              local_1228._16_8_ = *(undefined8 *)VVar17;
              local_1228._24_8_ = pVVar15[3];
              local_1228._0_8_ = VVar26;
            }
            else {
              local_1228._16_8_ = *(undefined8 *)VVar17;
              local_1228._0_8_ = *pVVar15;
            }
            local_1228._8_8_ = pVVar15[1];
            *pVVar15 = VVar17;
            pVVar15[1].x = 0.0;
            pVVar15[1].y = 0.0;
            *(undefined1 *)&pVVar15[2].x = 0;
            print((string *)local_1228);
            if ((Vec2)local_1228._0_8_ != VVar26) {
              operator_delete((void *)local_1228._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)face != &local_68) {
              operator_delete(face);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p);
            }
            puVar23 = (undefined1 *)CONCAT44(local_d8._4_4_,local_d8._0_4_);
            if (puVar23 != local_c8) {
LAB_0019b3e6:
              operator_delete(puVar23);
            }
          }
LAB_0019b3eb:
          uVar29 = uVar29 + 1;
          pfVar24 = pfVar24 + 8;
        } while (uVar29 != 0x80);
        pfVar10[iVar14].vertAdvance = (float)((local_80->size->metrics).height >> 6);
        glEnable(0xde1);
        glGenTextures(1,local_d8);
        glBindTexture(0xde1,local_d8._0_4_);
        glPixelStorei(0xcf5,1);
        glTexParameteri(0xde1,0x2800,0x2601);
        glTexParameteri(0xde1,0x2801,0x2601);
        glTexImage2D(0xde1,0,0x1908,(int)local_90.x,(int)local_90.y,0,0x1908,0x1401,0);
        if ((FT_Glyph)
            frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
            super__Vector_impl_data._M_start != glyph) {
          uVar29 = 0;
          lVar27 = 8;
          iVar28 = 0;
          do {
            pFVar20 = glyph;
            glTexSubImage2D(0xde1,0,iVar28,0,*(undefined4 *)((long)glyph + lVar27 + -8),
                            *(undefined4 *)((long)glyph + lVar27 + -4),0x1908,0x1401,
                            *(undefined8 *)((long)&glyph->library + lVar27));
            iVar4 = *(int *)((long)pFVar20 + lVar27 + -8);
            pvVar8 = *(void **)((long)&pFVar20->library + lVar27);
            if (pvVar8 != (void *)0x0) {
              operator_delete(pvVar8);
            }
            iVar28 = iVar28 + iVar4 + 2;
            uVar29 = uVar29 + 1;
            uVar18 = ((long)frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
                            super__Vector_impl_data._M_start - (long)glyph >> 3) *
                     -0x5555555555555555;
            lVar27 = lVar27 + 0x18;
          } while (uVar29 <= uVar18 && uVar18 - uVar29 != 0);
        }
        glPixelStorei(0xcf5,4);
        std::__cxx11::string::_M_assign((string *)&pfVar10[iVar14].hash);
        VVar9.y = local_90.y;
        VVar9.x = local_90.x;
        pfVar10[iVar14].atlasSize = VVar9;
        std::__cxx11::string::_M_assign((string *)&pfVar10[iVar14].path);
        pfVar10[iVar14].size = local_94;
        pfVar10[iVar14].empty = false;
        pfVar10[iVar14].atlas = local_d8._0_4_;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&face,
                       "loaded font \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
        puVar19 = (undefined8 *)std::__cxx11::string::append((char *)&face);
        psVar21 = puVar19 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar19 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar21) {
          local_58.field_2._M_allocated_capacity = *psVar21;
          local_58.field_2._8_8_ = puVar19[3];
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        }
        else {
          local_58.field_2._M_allocated_capacity = *psVar21;
          local_58._M_dataplus._M_p = (pointer)*puVar19;
        }
        local_58._M_string_length = puVar19[1];
        *puVar19 = psVar21;
        puVar19[1] = 0;
        *(undefined1 *)(puVar19 + 2) = 0;
        toStr_abi_cxx11_(&local_b8,(nite *)(ulong)local_94,(uint)local_58._M_string_length);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1228,&local_58,&local_b8);
        print((string *)local_1228);
        if (local_1228._0_8_ != (long)local_1228 + 0x10) {
          operator_delete((void *)local_1228._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)face != &local_68) {
          operator_delete(face);
        }
        if (0.0 < local_34) {
          FT_Stroker_Done(local_158);
        }
        FT_Done_Face(local_80);
        FT_Done_FreeType((FT_Library)pathAndSize.field_2._8_8_);
        if (glyph != (FT_Glyph)0x0) {
          operator_delete(glyph);
        }
      }
      else {
        std::operator+(&local_58,"failure loading font \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
        pVVar15 = (Vec2 *)std::__cxx11::string::append((char *)&local_58);
        VVar26 = (Vec2)(pVVar15 + 2);
        if (*pVVar15 == VVar26) {
          local_1228._16_8_ = *(undefined8 *)VVar26;
          local_1228._24_8_ = pVVar15[3];
          local_1228._0_8_ = (long)local_1228 + 0x10;
        }
        else {
          local_1228._16_8_ = *(undefined8 *)VVar26;
          local_1228._0_8_ = *pVVar15;
        }
        local_1228._8_8_ = pVVar15[1];
        *pVVar15 = VVar26;
        pVVar15[1].x = 0.0;
        pVVar15[1].y = 0.0;
        *(undefined1 *)&pVVar15[2].x = 0;
        print((string *)local_1228);
        if (local_1228._0_8_ != (long)local_1228 + 0x10) {
          operator_delete((void *)local_1228._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p);
        }
        FT_Done_FreeType((FT_Library)pathAndSize.field_2._8_8_);
      }
    }
    else {
      iVar6._M_current =
           pfVar10[(uint)VVar17.x].owners.
           super__Vector_base<nite::Font_*,_std::allocator<nite::Font_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          pfVar10[(uint)VVar17.x].owners.
          super__Vector_base<nite::Font_*,_std::allocator<nite::Font_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<nite::Font*,std::allocator<nite::Font*>>::_M_realloc_insert<nite::Font*>
                  ((vector<nite::Font*,std::allocator<nite::Font*>> *)
                   &pfVar10[(uint)VVar17.x].owners,iVar6,(Font **)local_1228);
      }
      else {
        *iVar6._M_current = this;
        pppFVar1 = &pfVar10[(uint)VVar17.x].owners.
                    super__Vector_base<nite::Font_*,_std::allocator<nite::Font_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppFVar1 = *pppFVar1 + 1;
      }
    }
    if (local_188 != (undefined1  [8])&fileHash._M_string_length) {
      operator_delete((void *)local_188);
    }
    if (stroke == (FT_Glyph)&pathAndSize._M_string_length) goto LAB_0019ab26;
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stroke,
                   "couldn\'t load font \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
    pVVar15 = (Vec2 *)std::__cxx11::string::append((char *)&stroke);
    VVar26 = (Vec2)(pVVar15 + 2);
    if (*pVVar15 == VVar26) {
      local_1228._16_8_ = *(undefined8 *)VVar26;
      local_1228._24_8_ = pVVar15[3];
      local_1228._0_8_ = (long)local_1228 + 0x10;
    }
    else {
      local_1228._16_8_ = *(undefined8 *)VVar26;
      local_1228._0_8_ = *pVVar15;
    }
    local_1228._8_8_ = pVVar15[1];
    *pVVar15 = VVar26;
    pVVar15[1].x = 0.0;
    pVVar15[1].y = 0.0;
    *(undefined1 *)&pVVar15[2].x = 0;
    print((string *)local_1228);
    if (local_1228._0_8_ != (long)local_1228 + 0x10) {
      operator_delete((void *)local_1228._0_8_);
    }
    if (stroke == (FT_Glyph)&pathAndSize._M_string_length) goto LAB_0019ab26;
  }
  operator_delete(stroke);
LAB_0019ab26:
  if (frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (pointer)&filename._M_string_length) {
    operator_delete(frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

void nite::Font::load(const String &path, unsigned size, float thickness){
	FT_Library library;
	FT_Face face;
	String filename = path;
	size *= SCALING;
	ln = -1.0f;

	if(!nite::fileExists(filename)){
		nite::print("couldn't load font '"+filename+"': doesn't exist");
		return;
	}

	if(FT_Init_FreeType(&library)){
		nite::print("failure starting FreeType: FT_Init_FreeType");
		return;
	}

	if(FT_New_Face(library, filename.c_str(), 0, &face)) {
		nite::print("failure loading font '"+filename+"': FT_New_Face");
		FT_Done_FreeType(library);
		return;
	}	

	unload();
	String pathAndSize = path+nite::toStr(size);
	String fileHash = nite::hashMemory((char*)pathAndSize.c_str(), pathAndSize.size());
	objectId = getSlotByHash(fileHash);
	if (objectId <= -1){
		objectId = getEmptySlot();
		fontList[objectId].empty = false;
		fontList[objectId].owners.push_back(this);
		fontList[objectId].hash = fileHash;
    	fontList[objectId].filename = path;
	}else{
		fontList[objectId].owners.push_back(this);
		return;
	}
	fontT &proxy = fontList[objectId];


	if(FT_Set_Char_Size(face, size << 6, size << 6, 96, 96)){
		nite::print("failure loading font '"+filename+"': FT_New_Face");
		FT_Done_FreeType(library);		
		return;
	}

	FT_Stroker stroker;
	if(thickness > 0.0f){
		FT_Stroker_New(library, &stroker);
		FT_Stroker_Set(stroker, (int)(thickness * 64.0f), FT_STROKER_LINECAP_ROUND, FT_STROKER_LINEJOIN_ROUND, 0);
	}
	Vector<Single> frags; // maybe a vector could be too slow?
	nite::Vec2 dims;
	int xcursor = 0.0f;
	// render characters
	for(int i = ASCII_MIN; i < ASCII_MAX; i++){
		FT_UInt cindex = FT_Get_Char_Index(face, i);
		FT_Glyph glyph, stroke;
		if(FT_Load_Glyph(face, cindex, FT_LOAD_DEFAULT)){
			nite::print("failed to load char '"+nite::toStr((char)i)+"' for font '"+filename+"'");
			continue;
		}
		if(FT_Get_Glyph(face->glyph, &glyph)){
			nite::print("failed to load char '"+nite::toStr((char)i)+"' for font '"+filename+"'");
			continue;
		}
		if(thickness > 0.0f){
			if(FT_Get_Glyph(face->glyph, &stroke)){
				nite::print("failed to load char '"+nite::toStr((char)i)+"' for font '"+filename+"'");
				continue;
			}		
			// stroke
			FT_Glyph_StrokeBorder(&stroke, stroker, 0, 1);			
		}
		// render to bitmap
		FT_Glyph_To_Bitmap(&glyph, FT_RENDER_MODE_NORMAL, NULL, true);
		FT_BitmapGlyph bitmap = reinterpret_cast<FT_BitmapGlyph>(glyph);
		FT_BitmapGlyph bitmapStroke;
		if(thickness > 0.0f){
			FT_Glyph_To_Bitmap(&stroke, FT_RENDER_MODE_NORMAL, NULL, true);
			bitmapStroke = reinterpret_cast<FT_BitmapGlyph>(stroke);
		}
		
		Single buffer;

		// render filler alone
		if(thickness == 0.0f){
			buffer = Single();
			buffer.pure(bitmap->bitmap.width, bitmap->bitmap.rows, bitmap->bitmap.buffer);
		// render outline as a strong and blit on it the filler
		}else{
			buffer = Single();
			buffer.strong(bitmapStroke->bitmap.width, bitmapStroke->bitmap.rows, bitmapStroke->bitmap.buffer);
			buffer.blitz(bitmap->bitmap.width, bitmap->bitmap.rows, bitmap->bitmap.buffer);		
		}

		frags.push_back(buffer);
		auto biggest = thickness == 0.0f ? bitmap : bitmapStroke;

		// metrics
		proxy.glyphs[i].index.x = xcursor;
		proxy.glyphs[i].index.y = 0;
		proxy.glyphs[i].coors.x = biggest->bitmap.width;
		proxy.glyphs[i].coors.y = biggest->bitmap.rows;
		proxy.glyphs[i].orig.x = biggest->left;
		proxy.glyphs[i].orig.y = biggest->top; 
		proxy.glyphs[i].size.x = face->glyph->advance.x >> 6;
		proxy.glyphs[i].size.y = face->glyph->metrics.horiBearingY >> 6;
		// atlas info
		dims.x += biggest->bitmap.width + 2;
		dims.y = std::max((unsigned)dims.y, biggest->bitmap.rows);
		// cursor update
		xcursor += biggest->bitmap.width + 2;
		FT_Done_Glyph(glyph);
		if(thickness > 0.0f){
			FT_Done_Glyph(stroke);
		}
	}
	proxy.vertAdvance = face->size->metrics.height >> 6;

	// compose atlas
	// TODO: might use a more complex algorithm than just a very long texture
	// specially if we ever get to implement unicode
	GLuint atlas;
	glEnable(GL_TEXTURE_2D);
	glGenTextures(1, &atlas);
	glBindTexture(GL_TEXTURE_2D, atlas);
	glPixelStorei(GL_UNPACK_ALIGNMENT, 1);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);	
	glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, dims.x, dims.y, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);	
	xcursor = 0;
	for(int i = 0; i < frags.size(); ++i){
		auto &frag = frags[i];
		glTexSubImage2D(GL_TEXTURE_2D, 0, xcursor, 0, frag.w, frag.h, GL_RGBA, GL_UNSIGNED_BYTE, frag.buffer);
		xcursor += frag.w + 2;
		frag.clear();
	}
	glPixelStorei(GL_UNPACK_ALIGNMENT, 4);
	// finish up
	proxy.hash = fileHash;
	proxy.atlasSize = dims;
	proxy.path = path;
	proxy.size = size;
	proxy.empty = false;
	proxy.atlas = atlas;

	nite::print("loaded font '"+filename+"' size: "+nite::toStr(size));

	// clean up
	if(thickness > 0.0f){
		FT_Stroker_Done(stroker);
	}
	FT_Done_Face(face);
	FT_Done_FreeType(library);
}